

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pliocomp.c
# Opt level: O0

int pl_p2li(int *pxsrc,int xs,short *lldst,int npix)

{
  int iVar1;
  int iVar2;
  int iVar3;
  short local_78;
  short local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int nz;
  int pv;
  int nv;
  int iz;
  int op;
  int np;
  int xe;
  int dv;
  int ip;
  int hi;
  int x1;
  int v;
  int zero;
  int i__3;
  int i__2;
  int i__1;
  int ret_val;
  int npix_local;
  short *lldst_local;
  int xs_local;
  int *pxsrc_local;
  
  nz = 0;
  if (npix < 1) {
    i__2 = 0;
  }
  else {
    lldst[2] = -100;
    lldst[1] = 7;
    *lldst = 0;
    lldst[5] = 0;
    lldst[6] = 0;
    iVar1 = xs + npix + -1;
    nv = 8;
    local_6c = pxsrc[(long)xs + -1];
    if (local_6c < 0) {
      local_6c = 0;
    }
    local_64 = local_6c;
    dv = 1;
    pv = xs;
    ip = xs;
    for (xe = xs; xe <= iVar1; xe = xe + 1) {
      if (xe < iVar1) {
        local_70 = pxsrc[(long)(xe + 1) + -1];
        if (local_70 < 0) {
          local_70 = 0;
        }
        nz = local_70;
        if (local_70 != local_64) {
          iVar3 = ip;
          if (local_64 != 0) goto LAB_0024347b;
          local_64 = local_70;
          ip = xe + 1;
        }
      }
      else {
        iVar3 = xs + npix;
        if (local_64 != 0) {
          iVar3 = ip;
        }
LAB_0024347b:
        ip = iVar3;
        iz = (xe - ip) + 1;
        local_68 = ip - pv;
        iVar3 = nv;
        if ((local_64 < 1) || (iVar2 = local_64 - dv, iVar2 == 0)) {
LAB_002435a1:
          nv = iVar3;
          if (0 < local_68) {
            for (; 0 < local_68; local_68 = local_68 + -0xfff) {
              if (local_68 < 0x1000) {
                local_74 = (short)local_68;
              }
              else {
                local_74 = 0xfff;
              }
              lldst[(long)nv + -1] = local_74;
              nv = nv + 1;
            }
            if ((iz == 1) && (0 < local_64)) {
              lldst[(long)(nv + -1) + -1] = lldst[(long)(nv + -1) + -1] + 0x5001;
              goto LAB_00243687;
            }
          }
          for (; 0 < iz; iz = iz + -0xfff) {
            if (iz < 0x1000) {
              local_78 = (short)iz;
            }
            else {
              local_78 = 0xfff;
            }
            lldst[(long)nv + -1] = local_78 + 0x4000;
            nv = nv + 1;
          }
        }
        else {
          dv = local_64;
          iVar3 = iVar2;
          if (iVar2 < 1) {
            iVar3 = -iVar2;
          }
          if (0xfff < iVar3) {
            lldst[(long)nv + -1] = ((ushort)local_64 & 0xfff) + 0x1000;
            lldst[(long)(nv + 1) + -1] = (short)((long)local_64 / 0x1000);
            iVar3 = nv + 2;
            goto LAB_002435a1;
          }
          if (iVar2 < 0) {
            lldst[(long)nv + -1] = 0x3000 - (short)iVar2;
          }
          else {
            lldst[(long)nv + -1] = (short)iVar2 + 0x2000;
          }
          iVar3 = nv + 1;
          if ((iz != 1) || (local_68 != 0)) goto LAB_002435a1;
          lldst[(long)nv + -1] = lldst[(long)nv + -1] | 0x4000;
          nv = iVar3;
        }
LAB_00243687:
        pv = xe + 1;
        local_64 = nz;
        ip = pv;
      }
    }
    lldst[3] = (short)((nv + -1) % 0x8000);
    lldst[4] = (short)((long)(nv + -1) / 0x8000);
    i__2 = nv + -1;
  }
  return i__2;
}

Assistant:

int pl_p2li (int *pxsrc, int xs, short *lldst, int npix)
/* int *pxsrc;                      input pixel array */
/* int xs;                          starting index in pxsrc (?) */
/* short *lldst;                    encoded line list */
/* int npix;                        number of pixels to convert */
{
    /* System generated locals */
    int ret_val, i__1, i__2, i__3;

    /* Local variables */
    int zero, v, x1, hi, ip, dv, xe, np, op, iz, nv = 0, pv, nz;

    /* Parameter adjustments */
    --lldst;
    --pxsrc;

    /* Function Body */
    if (! (npix <= 0)) {
        goto L110;
    }
    ret_val = 0;
    goto L100;
L110:
    lldst[3] = -100;
    lldst[2] = 7;
    lldst[1] = 0;
    lldst[6] = 0;
    lldst[7] = 0;
    xe = xs + npix - 1;
    op = 8;
    zero = 0;
/* Computing MAX */
    i__1 = zero, i__2 = pxsrc[xs];
    pv = max(i__1,i__2);
    x1 = xs;
    iz = xs;
    hi = 1;
    i__1 = xe;
    for (ip = xs; ip <= i__1; ++ip) {
        if (! (ip < xe)) {
            goto L130;
        }
/* Computing MAX */
        i__2 = zero, i__3 = pxsrc[ip + 1];
        nv = max(i__2,i__3);
        if (! (nv == pv)) {
            goto L140;
        }
        goto L120;
L140:
        if (! (pv == 0)) {
            goto L150;
        }
        pv = nv;
        x1 = ip + 1;
        goto L120;
L150:
        goto L131;
L130:
        if (! (pv == 0)) {
            goto L160;
        }
        x1 = xe + 1;
L160:
L131:
        np = ip - x1 + 1;
        nz = x1 - iz;
        if (! (pv > 0)) {
            goto L170;
        }
        dv = pv - hi;
        if (! (dv != 0)) {
            goto L180;
        }
        hi = pv;
        if (! (abs(dv) > 4095)) {
            goto L190;
        }
        lldst[op] = (short) ((pv & 4095) + 4096);
        ++op;
        lldst[op] = (short) (pv / 4096);
        ++op;
        goto L191;
L190:
        if (! (dv < 0)) {
            goto L200;
        }
        lldst[op] = (short) (-dv + 12288);
        goto L201;
L200:
        lldst[op] = (short) (dv + 8192);
L201:
        ++op;
        if (! (np == 1 && nz == 0)) {
            goto L210;
        }
        v = lldst[op - 1];
        lldst[op - 1] = (short) (v | 16384);
        goto L91;
L210:
L191:
L180:
L170:
        if (! (nz > 0)) {
            goto L220;
        }
L230:
        if (! (nz > 0)) {
            goto L232;
        }
        lldst[op] = (short) min(4095,nz);
        ++op;
/* L231: */
        nz += -4095;
        goto L230;
L232:
        if (! (np == 1 && pv > 0)) {
            goto L240;
        }
        lldst[op - 1] = (short) (lldst[op - 1] + 20481);
        goto L91;
L240:
L220:
L250:
        if (! (np > 0)) {
            goto L252;
        }
        lldst[op] = (short) (min(4095,np) + 16384);
        ++op;
/* L251: */
        np += -4095;
        goto L250;
L252:
L91:
        x1 = ip + 1;
        iz = x1;
        pv = nv;
L120:
        ;
    }
/* L121: */
    lldst[4] = (short) ((op - 1) % 32768);
    lldst[5] = (short) ((op - 1) / 32768);
    ret_val = op - 1;
    goto L100;
L100:
    return ret_val;
}